

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O0

bool __thiscall ON_NurbsCage::IsParallelogram(ON_NurbsCage *this,double tolerance)

{
  int iVar1;
  double *pdVar2;
  long lVar3;
  bool local_20a;
  bool local_209;
  double *local_1f0;
  ON_3dPoint local_1e8;
  ON_3dPoint local_1d0;
  ON_3dPoint local_1b8;
  ON_3dPoint local_1a0;
  ON_3dPoint local_188;
  ON_3dPoint local_170;
  ON_3dPoint local_158;
  double local_140 [2];
  bool local_129;
  undefined1 auStack_128 [7];
  bool rc;
  ON_3dPoint B;
  ON_3dPoint Q;
  ON_3dPoint Z;
  ON_3dPoint Y;
  ON_3dPoint X;
  ON_3dPoint P;
  double dStack_90;
  ON_Interval OStack_88;
  ON_Interval OStack_78;
  double local_68;
  double dist;
  double z;
  double y;
  double x;
  double t;
  double s;
  double r;
  int local_28;
  int k;
  int j;
  int i;
  double tolerance_local;
  ON_NurbsCage *this_local;
  
  local_1f0 = &P.z;
  _j = tolerance;
  tolerance_local = (double)this;
  do {
    ON_Interval::ON_Interval((ON_Interval *)local_1f0);
    local_1f0 = local_1f0 + 2;
  } while (local_1f0 != &local_68);
  iVar1 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])(this,0);
  local_129 = (bool)(-(char)iVar1 & 1);
  k = 0;
  while( true ) {
    local_209 = false;
    if (k < 3) {
      local_209 = local_129;
    }
    if (local_209 == false) break;
    local_140 = (double  [2])Domain(this,k);
    lVar3 = (long)k;
    (&P.z)[lVar3 * 2] = local_140[0];
    (&dStack_90)[lVar3 * 2] = local_140[1];
    pdVar2 = ON_Interval::operator[]((ON_Interval *)(&P.z + (long)k * 2),0);
    local_20a = false;
    if ((*pdVar2 == *this->m_knot[k]) && (!NAN(*pdVar2) && !NAN(*this->m_knot[k]))) {
      pdVar2 = ON_Interval::operator[]((ON_Interval *)(&P.z + (long)k * 2),1);
      local_20a = *pdVar2 == this->m_knot[k][this->m_cv_count[k] + this->m_order[k] + -3];
    }
    local_129 = local_20a;
    k = k + 1;
  }
  if (local_129 != false) {
    GetCV(this,0,0,0,(ON_3dPoint *)&X.z);
    GetCV(this,this->m_cv_count[0] + -1,0,0,(ON_3dPoint *)&Y.z);
    GetCV(this,0,this->m_cv_count[1] + -1,0,(ON_3dPoint *)&Z.z);
    GetCV(this,0,0,this->m_cv_count[2] + -1,(ON_3dPoint *)&Q.z);
    if (_j < 2.3283064365386963e-10) {
      _j = 2.3283064365386963e-10;
    }
    for (k = 0; k < this->m_cv_count[0]; k = k + 1) {
      s = ON_GrevilleAbcissa(this->m_order[0],this->m_knot[0] + k);
      y = ON_Interval::NormalizedParameterAt((ON_Interval *)&P.z,s);
      for (local_28 = 0; local_28 < this->m_cv_count[1]; local_28 = local_28 + 1) {
        t = ON_GrevilleAbcissa(this->m_order[1],this->m_knot[1] + local_28);
        z = ON_Interval::NormalizedParameterAt(&OStack_88,t);
        for (r._4_4_ = 0; r._4_4_ < this->m_cv_count[2]; r._4_4_ = r._4_4_ + 1) {
          x = ON_GrevilleAbcissa(this->m_order[2],this->m_knot[2] + r._4_4_);
          dist = ON_Interval::NormalizedParameterAt(&OStack_78,x);
          Evaluate(this,s,t,x,0,3,&B.z,0,(int *)0x0);
          ::operator*(&local_1a0,((1.0 - y) - z) - dist,(ON_3dPoint *)&X.z);
          ::operator*(&local_1b8,y,(ON_3dPoint *)&Y.z);
          ON_3dPoint::operator+(&local_188,&local_1a0,&local_1b8);
          ::operator*(&local_1d0,z,(ON_3dPoint *)&Z.z);
          ON_3dPoint::operator+(&local_170,&local_188,&local_1d0);
          ::operator*(&local_1e8,dist,(ON_3dPoint *)&Q.z);
          ON_3dPoint::operator+(&local_158,&local_170,&local_1e8);
          _auStack_128 = local_158.x;
          B.x = local_158.y;
          B.y = local_158.z;
          local_68 = ON_3dPoint::DistanceTo((ON_3dPoint *)auStack_128,(ON_3dPoint *)&B.z);
          if (_j < local_68) {
            return false;
          }
        }
      }
    }
  }
  return (bool)(local_129 & 1);
}

Assistant:

bool ON_NurbsCage::IsParallelogram(double tolerance) const
{
  int i,j,k;
  double r,s,t;
  double x,y,z,dist;
  ON_Interval d[3];
  ON_3dPoint P, X, Y, Z, Q, B;

  bool rc = IsValid()?true:false;

  for ( i = 0; i < 3 && rc; i++ )
  {
    d[i] = Domain(i);
    rc = (    d[i][0] == m_knot[i][0]
           && d[i][1] == m_knot[i][m_cv_count[i]+m_order[i]-3]
           );
  }

  if (rc)
  {
    GetCV(0,0,0,P);
    GetCV(m_cv_count[0]-1,0,0,X);
    GetCV(0,m_cv_count[1]-1,0,Y);
    GetCV(0,0,m_cv_count[2]-1,Z);

    if ( tolerance < ON_ZERO_TOLERANCE )
      tolerance = ON_ZERO_TOLERANCE;

    for ( i = 0; i < m_cv_count[0]; i++ )
    {
      r = ON_GrevilleAbcissa(m_order[0],m_knot[0]+i);
      x = d[0].NormalizedParameterAt(r);
      for ( j = 0; j < m_cv_count[1]; j++ )
      {
        s = ON_GrevilleAbcissa(m_order[1],m_knot[1]+j);
        y = d[1].NormalizedParameterAt(s);
        for ( k = 0; k < m_cv_count[2]; k++ )
        {
          t = ON_GrevilleAbcissa(m_order[2],m_knot[2]+k);
          z = d[2].NormalizedParameterAt(t);
          Evaluate(r,s,t,0,3,&Q.x);
          B = (1.0-x-y-z)*P + x*X + y*Y + z*Z;
          dist = B.DistanceTo(Q);
          if ( dist > tolerance )
            return false;          
        }
      }
    }
  }

  return rc;
}